

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseConnection(Parser *this)

{
  bool bVar1;
  InterpolationType IVar2;
  Module *pMVar3;
  undefined1 local_c8 [8];
  ProcessorAndChannel dst;
  int32_t local_7c;
  char *local_78;
  char *local_70;
  undefined1 local_68 [8];
  ProcessorAndChannel src;
  pool_ref<soul::heart::Connection> local_20;
  Connection *local_18;
  Connection *c;
  Parser *this_local;
  
  c = (Connection *)this;
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_18 = Module::allocate<soul::heart::Connection,soul::CodeLocation&>
                       (pMVar3,&(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).location);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  pool_ref<soul::heart::Connection>::pool_ref<soul::heart::Connection,void>(&local_20,local_18);
  std::
  vector<soul::pool_ref<soul::heart::Connection>,_std::allocator<soul::pool_ref<soul::heart::Connection>_>_>
  ::push_back(&pMVar3->connections,&local_20);
  pool_ref<soul::heart::Connection>::~pool_ref(&local_20);
  IVar2 = parseInterpolationType<soul::heart::Parser>(this);
  local_18->interpolationType = IVar2;
  readProcessorAndChannel((ProcessorAndChannel *)local_68,this);
  (local_18->source).processor.object = (ProcessorInstance *)local_68;
  std::__cxx11::string::operator=((string *)&(local_18->source).endpointName,(string *)&src);
  (local_18->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)src.endpoint.field_2._8_8_;
  *(_Storage<unsigned_long,_true> *)
   &(local_18->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
       src.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_70 = "->";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x54e748);
  local_78 = "[";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x575e01);
  if (bVar1) {
    local_7c = parseInt32(this);
    std::optional<long>::operator=(&local_18->delayLength,&local_7c);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x54ace4);
    dst.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = (long)"operator->" + 8;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x54e748);
  }
  readProcessorAndChannel((ProcessorAndChannel *)local_c8,this);
  (local_18->dest).processor.object = (ProcessorInstance *)local_c8;
  std::__cxx11::string::operator=((string *)&(local_18->dest).endpointName,(string *)&dst);
  (local_18->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (_Storage<unsigned_long,_true>)dst.endpoint.field_2._8_8_;
  *(_Storage<unsigned_long,_true> *)
   &(local_18->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged =
       dst.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  expectSemicolon(this);
  ProcessorAndChannel::~ProcessorAndChannel((ProcessorAndChannel *)local_c8);
  ProcessorAndChannel::~ProcessorAndChannel((ProcessorAndChannel *)local_68);
  return;
}

Assistant:

void parseConnection()
    {
        auto& c = module->allocate<heart::Connection> (location);
        module->connections.push_back (c);

        c.interpolationType = parseInterpolationType (*this);
        auto src = readProcessorAndChannel();
        c.source.processor = src.processor;
        c.source.endpointName = src.endpoint;
        c.source.endpointIndex = src.endpointIndex;
        expect (HEARTOperator::rightArrow);

        if (matchIf (HEARTOperator::openBracket))
        {
            c.delayLength = parseInt32();

            expect (HEARTOperator::closeBracket);
            expect (HEARTOperator::rightArrow);
        }

        auto dst = readProcessorAndChannel();
        c.dest.processor = dst.processor;
        c.dest.endpointName = dst.endpoint;
        c.dest.endpointIndex = dst.endpointIndex;

        expectSemicolon();
    }